

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

int Gia_ManSimWriteFile(char *pFileOut,Vec_Int_t *vPat,int nOuts)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  
  __stream = fopen(pFileOut,"wb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open output file.");
    iVar1 = 0;
  }
  else {
    if (vPat->nSize % nOuts != 0) {
      __assert_fail("Vec_IntSize(vPat) % nOuts == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                    ,0x2b6,"int Gia_ManSimWriteFile(char *, Vec_Int_t *, int)");
    }
    if (0 < vPat->nSize) {
      uVar2 = 0;
      do {
        fputc(vPat->pArray[uVar2] + 0x30,__stream);
        if ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                 (long)nOuts) == nOuts + -1) {
          fputc(10,__stream);
        }
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)vPat->nSize);
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Gia_ManSimWriteFile( char * pFileOut, Vec_Int_t * vPat, int nOuts )
{
    int c, i;
    FILE * pFile = fopen( pFileOut, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return 0;
    }
    assert( Vec_IntSize(vPat) % nOuts == 0 );
    Vec_IntForEachEntry( vPat, c, i )
    {
        fputc( '0' + c, pFile );
        if ( i % nOuts == nOuts - 1 )
            fputc( '\n', pFile );
    }
    fclose( pFile );
    return 1;
}